

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test::
TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test
          (TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test *this)

{
  TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::TEST_GROUP_CppUTestGroupMinipointCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MinipointCounterTest_ChooseHighestPointsWait_AnotherHandOrder_Test_00257628;
  return;
}

Assistant:

TEST(MinipointCounterTest, ChooseHighestPointsWait_AnotherHandOrder)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::ThreeOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCircles, true);
	addSequence(Tile::OneOfBamboos, true);

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}